

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O2

void __thiscall draco::RAnsSymbolDecoder<4>::~RAnsSymbolDecoder(RAnsSymbolDecoder<4> *this)

{
  RAnsDecoder<12>::~RAnsDecoder(&this->ans_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

RAnsSymbolDecoder() : num_symbols_(0) {}